

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<Catch::StringRef>
          (XmlWriter *this,string *name,StringRef *attribute)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  size_t sVar2;
  ReusableStringStream rss;
  ReusableStringStream local_58;
  string local_40;
  
  local_58.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001a0198;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar2 = StringStreams::add(&pSVar1->super_StringStreams);
  local_58.m_index = sVar2;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  local_58.m_oss =
       *(ostream **)
        &(pSVar1->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar2]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  std::ostream::write((char *)local_58.m_oss,(long)attribute->m_start);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  ReusableStringStream::~ReusableStringStream(&local_58);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }